

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref cashew::ValueBuilder::makeWhile(Ref condition,Ref body)

{
  Value *pVVar1;
  Ref r;
  Ref local_28;
  Ref local_20;
  Ref body_local;
  Ref condition_local;
  
  local_20.inst = body.inst;
  body_local = condition;
  local_28 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_28);
  r = makeRawString((IString *)WHILE);
  pVVar1 = cashew::Value::push_back(pVVar1,r);
  pVVar1 = cashew::Value::push_back(pVVar1,body_local);
  pVVar1 = cashew::Value::push_back(pVVar1,local_20);
  Ref::Ref(&condition_local,pVVar1);
  return (Ref)condition_local.inst;
}

Assistant:

static Ref makeWhile(Ref condition, Ref body) {
    return &makeRawArray(3)
              ->push_back(makeRawString(WHILE))
              .push_back(condition)
              .push_back(body);
  }